

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O0

Own<const_kj::ReadableDirectory> __thiscall
kj::ReadableDirectory::openSubdir(ReadableDirectory *this,PathPtr path)

{
  Own<const_kj::ReadableDirectory> *pOVar1;
  Clock *clock;
  undefined8 in_RCX;
  ReadableDirectory *extraout_RDX;
  Own<const_kj::ReadableDirectory> OVar2;
  Own<kj::Directory> local_80;
  Fault local_70;
  Fault f;
  Maybe<kj::Own<const_kj::ReadableDirectory>_> local_48;
  undefined1 local_38 [8];
  OwnOwn<const_kj::ReadableDirectory> dir;
  ReadableDirectory *this_local;
  PathPtr path_local;
  
  this_local = (ReadableDirectory *)path.parts.size_;
  dir.value.ptr = (ReadableDirectory *)path.parts.ptr;
  path_local.parts.size_ = (size_t)this;
  (**(code **)((((String *)dir.value.ptr)->content).ptr + 0x58))
            (&local_48,dir.value.ptr,this_local,in_RCX);
  _::readMaybe<kj::ReadableDirectory_const>((_ *)local_38,&local_48);
  Maybe<kj::Own<const_kj::ReadableDirectory>_>::~Maybe(&local_48);
  pOVar1 = _::OwnOwn::operator_cast_to_Own_((OwnOwn *)local_38);
  if (pOVar1 == (Own<const_kj::ReadableDirectory> *)0x0) {
    _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[26],kj::PathPtr&>
              (&local_70,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem.c++"
               ,0x230,FAILED,(char *)0x0,"\"no such file or directory\", path",
               (char (*) [26])"no such file or directory",(PathPtr *)&this_local);
    f.exception._0_4_ = 2;
    _::Debug::Fault::~Fault(&local_70);
    clock = nullClock();
    newInMemoryDirectory((kj *)&local_80,clock);
    Own<kj::ReadableDirectory_const>::Own<kj::Directory,void>
              ((Own<kj::ReadableDirectory_const> *)this,&local_80);
    Own<kj::Directory>::~Own(&local_80);
  }
  else {
    pOVar1 = _::OwnOwn<const_kj::ReadableDirectory>::operator*
                       ((OwnOwn<const_kj::ReadableDirectory> *)local_38);
    pOVar1 = mv<kj::Own<kj::ReadableDirectory_const>>(pOVar1);
    Own<const_kj::ReadableDirectory>::Own((Own<const_kj::ReadableDirectory> *)this,pOVar1);
  }
  f.exception._0_4_ = 1;
  _::OwnOwn<const_kj::ReadableDirectory>::~OwnOwn((OwnOwn<const_kj::ReadableDirectory> *)local_38);
  OVar2.ptr = extraout_RDX;
  OVar2.disposer = (Disposer *)this;
  return OVar2;
}

Assistant:

Own<const ReadableDirectory> ReadableDirectory::openSubdir(PathPtr path) const {
  KJ_IF_MAYBE(dir, tryOpenSubdir(path)) {
    return kj::mv(*dir);
  } else {
    KJ_FAIL_REQUIRE("no such file or directory", path) { break; }